

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsNumberToInt(JsValueRef value,int *asInt)

{
  bool bVar1;
  int32 iVar2;
  double T1;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  int *asInt_local;
  JsValueRef value_local;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (asInt == (int *)0x0) {
    return JsErrorNullArgument;
  }
  __debugCheckNoException = (DebugCheckNoException)asInt;
  DebugCheckNoException::DebugCheckNoException(&local_28);
  bVar1 = Js::TaggedInt::Is(value);
  if (bVar1) {
    iVar2 = Js::TaggedInt::ToInt32(value);
    *(int32 *)__debugCheckNoException = iVar2;
  }
  else {
    bVar1 = Js::JavascriptNumber::Is_NoTaggedIntCheck(value);
    if (!bVar1) {
      *(undefined4 *)__debugCheckNoException = 0;
      value_local._4_4_ = JsErrorInvalidArgument;
      bVar1 = true;
      goto LAB_00400815;
    }
    T1 = Js::JavascriptNumber::GetValue(value);
    iVar2 = Js::JavascriptConversion::ToInt32(T1);
    *(int32 *)__debugCheckNoException = iVar2;
  }
  bVar1 = false;
LAB_00400815:
  local_28.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_28);
  if (!bVar1) {
    value_local._4_4_ = JsNoError;
  }
  return value_local._4_4_;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsNumberToInt(_In_ JsValueRef value, _Out_ int *asInt)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(asInt);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (Js::TaggedInt::Is(value))
        {
            *asInt = Js::TaggedInt::ToInt32(value);
        }